

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O0

void __kmp_dispatch_init<unsigned_long_long>
               (ident_t *loc,int gtid,sched_type schedule,unsigned_long_long lb,
               unsigned_long_long ub,signed_t_conflict st,signed_t_conflict chunk,int push_ws)

{
  uint uVar1;
  kmp_info_t *pkVar2;
  kmp_team_p *pkVar3;
  int iVar4;
  uint uVar5;
  kmp_int64 *pkVar6;
  ompt_data_t *poVar7;
  ompt_task_info_t *poVar8;
  int in_EDX;
  int in_ESI;
  ident_t *in_RDI;
  int *size;
  bool bVar9;
  ident_t *in_stack_00000008;
  ompt_task_info_t *task_info;
  ompt_team_info_t *team_info;
  unsigned_long_long *p;
  kmp_uint64 schedtype;
  int itt_need_metadata_reporting;
  kmp_uint64 cur_chunk;
  dispatch_shared_info_template<unsigned_long_long> *sh;
  dispatch_private_info_template<unsigned_long_long> *pr;
  kmp_uint32 my_buffer_index;
  kmp_team_t *team;
  kmp_info_t *th;
  int active;
  unsigned_long_long in_stack_00000148;
  unsigned_long_long in_stack_00000150;
  sched_type in_stack_0000015c;
  dispatch_private_info_template<unsigned_long_long> *in_stack_00000160;
  int in_stack_0000016c;
  ident_t *in_stack_00000170;
  signed_t_conflict in_stack_00000180;
  kmp_uint64 *in_stack_00000188;
  signed_t_conflict in_stack_00000190;
  unsigned_long_long in_stack_00000198;
  unsigned_long_long in_stack_000001a0;
  void *in_stack_ffffffffffffff20;
  int depth;
  void *pvVar10;
  _func_kmp_uint32_uint_uint *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  uint checker;
  uint *in_stack_ffffffffffffff38;
  bool local_99;
  kmp_uint64 in_stack_ffffffffffffff78;
  kmp_uint64 iterations;
  undefined4 in_stack_ffffffffffffff88;
  ident_t *loc_00;
  dispatch_shared_info_t *local_68;
  dispatch_private_info_t *local_60;
  
  checker = (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  if (__kmp_init_parallel == 0) {
    __kmp_parallel_initialize();
  }
  __kmp_resume_if_soft_paused();
  pkVar2 = __kmp_threads[in_ESI];
  pkVar3 = (pkVar2->th).th_team;
  bVar9 = (pkVar3->t).t_serialized == 0;
  (pkVar2->th).th_ident = in_RDI;
  local_99 = false;
  loc_00 = in_stack_00000008;
  if ((__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) &&
     (local_99 = false, __kmp_forkjoin_frames_mode == 3)) {
    iVar4 = __kmp_tid_from_gtid(in_ESI);
    local_99 = false;
    loc_00 = in_stack_00000008;
    if ((iVar4 == 0) && (local_99 = false, (pkVar2->th).th_teams_microtask == (microtask_t)0x0)) {
      local_99 = (pkVar3->t).t_active_level == 1;
    }
  }
  uVar5 = (uint)local_99;
  if (bVar9) {
    uVar1 = ((pkVar2->th).th_dispatch)->th_disp_index;
    ((pkVar2->th).th_dispatch)->th_disp_index = uVar1 + 1;
    local_60 = ((pkVar2->th).th_dispatch)->th_disp_buffer +
               (ulong)uVar1 % (ulong)(uint)__kmp_dispatch_num_buffers;
    local_68 = (pkVar3->t).t_disp_buffer + (ulong)uVar1 % (ulong)(uint)__kmp_dispatch_num_buffers;
  }
  else {
    local_60 = ((pkVar2->th).th_dispatch)->th_disp_buffer;
  }
  size = (int *)(long)(pkVar2->th).th_team_nproc;
  iVar4 = *(int *)(pkVar2->th_pad + 0x20) >> 0x1f;
  __kmp_dispatch_init_algorithm<unsigned_long_long>
            (in_stack_00000170,in_stack_0000016c,in_stack_00000160,in_stack_0000015c,
             in_stack_00000150,in_stack_00000148,in_stack_00000180,in_stack_00000188,
             in_stack_00000190,in_stack_00000198,in_stack_000001a0);
  if (bVar9) {
    if (((uint)local_60->flags & 1) == 0) {
      ((pkVar2->th).th_dispatch)->th_deo_fcn = __kmp_dispatch_deo_error;
      ((pkVar2->th).th_dispatch)->th_dxo_fcn = __kmp_dispatch_dxo_error;
    }
    else {
      ((pkVar2->th).th_dispatch)->th_deo_fcn = __kmp_dispatch_deo<unsigned_long_long>;
      ((pkVar2->th).th_dispatch)->th_dxo_fcn = __kmp_dispatch_dxo<unsigned_long_long>;
    }
  }
  if (bVar9) {
    __kmp_wait<unsigned_int>
              (in_stack_ffffffffffffff38,checker,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20
              );
    ((pkVar2->th).th_dispatch)->th_dispatch_pr_current = local_60;
    ((pkVar2->th).th_dispatch)->th_dispatch_sh_current = local_68;
    if (((uint)local_60->flags & 1) != 0) {
      __kmp_itt_ordered_init((int)((ulong)size >> 0x20));
    }
    if (uVar5 != 0) {
      iterations = 0;
      switch(in_EDX) {
      case 0x21:
      case 0x29:
        break;
      default:
        iterations = 3;
        break;
      case 0x23:
        iterations = 1;
        break;
      case 0x28:
        loc_00 = (ident_t *)(local_60->u).p64.field_6.parm1;
        break;
      case 0x2a:
      case 0x2b:
      case 0x2e:
        iterations = 2;
      }
      __kmp_itt_metadata_loop
                (loc_00,CONCAT44(uVar5,in_stack_ffffffffffffff88),iterations,
                 in_stack_ffffffffffffff78);
    }
  }
  depth = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  if (in_EDX == 0x2c) {
    pkVar6 = &(local_60->u).p64.static_steal_counter;
    *pkVar6 = *pkVar6 + 1;
  }
  if (((ulong)ompt_enabled >> 0x14 & 1) != 0) {
    poVar7 = &__ompt_get_teaminfo(iVar4,size)->parallel_data;
    poVar8 = __ompt_get_task_info_object(depth);
    if ((pkVar2->th).ompt_thread_info.return_address == (void *)0x0) {
      pvVar10 = poVar7[1].ptr;
    }
    else {
      pvVar10 = (pkVar2->th).ompt_thread_info.return_address;
    }
    (*ompt_callbacks.ompt_callback_work_callback)
              (ompt_work_loop,ompt_scope_begin,poVar7,&poVar8->task_data,(local_60->u).p64.tc,
               pvVar10);
  }
  return;
}

Assistant:

static void
__kmp_dispatch_init(ident_t *loc, int gtid, enum sched_type schedule, T lb,
                    T ub, typename traits_t<T>::signed_t st,
                    typename traits_t<T>::signed_t chunk, int push_ws) {
  typedef typename traits_t<T>::unsigned_t UT;

  int active;
  kmp_info_t *th;
  kmp_team_t *team;
  kmp_uint32 my_buffer_index;
  dispatch_private_info_template<T> *pr;
  dispatch_shared_info_template<T> volatile *sh;

  KMP_BUILD_ASSERT(sizeof(dispatch_private_info_template<T>) ==
                   sizeof(dispatch_private_info));
  KMP_BUILD_ASSERT(sizeof(dispatch_shared_info_template<UT>) ==
                   sizeof(dispatch_shared_info));

  if (!TCR_4(__kmp_init_parallel))
    __kmp_parallel_initialize();

  __kmp_resume_if_soft_paused();

#if INCLUDE_SSC_MARKS
  SSC_MARK_DISPATCH_INIT();
#endif
#ifdef KMP_DEBUG
  typedef typename traits_t<T>::signed_t ST;
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format("__kmp_dispatch_init: T#%%d called: schedule:%%d "
                            "chunk:%%%s lb:%%%s ub:%%%s st:%%%s\n",
                            traits_t<ST>::spec, traits_t<T>::spec,
                            traits_t<T>::spec, traits_t<ST>::spec);
    KD_TRACE(10, (buff, gtid, schedule, chunk, lb, ub, st));
    __kmp_str_free(&buff);
  }
#endif
  /* setup data */
  th = __kmp_threads[gtid];
  team = th->th.th_team;
  active = !team->t.t_serialized;
  th->th.th_ident = loc;

  // Any half-decent optimizer will remove this test when the blocks are empty
  // since the macros expand to nothing
  // when statistics are disabled.
  if (schedule == __kmp_static) {
    KMP_COUNT_BLOCK(OMP_LOOP_STATIC);
  } else {
    KMP_COUNT_BLOCK(OMP_LOOP_DYNAMIC);
  }

#if KMP_USE_HIER_SCHED
  // Initialize the scheduling hierarchy if requested in OMP_SCHEDULE envirable
  // Hierarchical scheduling does not work with ordered, so if ordered is
  // detected, then revert back to threaded scheduling.
  bool ordered;
  enum sched_type my_sched = schedule;
  my_buffer_index = th->th.th_dispatch->th_disp_index;
  pr = reinterpret_cast<dispatch_private_info_template<T> *>(
      &th->th.th_dispatch
           ->th_disp_buffer[my_buffer_index % __kmp_dispatch_num_buffers]);
  my_sched = SCHEDULE_WITHOUT_MODIFIERS(my_sched);
  if ((my_sched >= kmp_nm_lower) && (my_sched < kmp_nm_upper))
    my_sched =
        (enum sched_type)(((int)my_sched) - (kmp_nm_lower - kmp_sch_lower));
  ordered = (kmp_ord_lower & my_sched);
  if (pr->flags.use_hier) {
    if (ordered) {
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d ordered loop detected.  "
                     "Disabling hierarchical scheduling.\n",
                     gtid));
      pr->flags.use_hier = FALSE;
    }
  }
  if (schedule == kmp_sch_runtime && __kmp_hier_scheds.size > 0) {
    // Don't use hierarchical for ordered parallel loops and don't
    // use the runtime hierarchy if one was specified in the program
    if (!ordered && !pr->flags.use_hier)
      __kmp_dispatch_init_hier_runtime<T>(loc, lb, ub, st);
  }
#endif // KMP_USE_HIER_SCHED

#if USE_ITT_BUILD
  kmp_uint64 cur_chunk = chunk;
  int itt_need_metadata_reporting =
      __itt_metadata_add_ptr && __kmp_forkjoin_frames_mode == 3 &&
      KMP_MASTER_GTID(gtid) && th->th.th_teams_microtask == NULL &&
      team->t.t_active_level == 1;
#endif
  if (!active) {
    pr = reinterpret_cast<dispatch_private_info_template<T> *>(
        th->th.th_dispatch->th_disp_buffer); /* top of the stack */
  } else {
    KMP_DEBUG_ASSERT(th->th.th_dispatch ==
                     &th->th.th_team->t.t_dispatch[th->th.th_info.ds.ds_tid]);

    my_buffer_index = th->th.th_dispatch->th_disp_index++;

    /* What happens when number of threads changes, need to resize buffer? */
    pr = reinterpret_cast<dispatch_private_info_template<T> *>(
        &th->th.th_dispatch
             ->th_disp_buffer[my_buffer_index % __kmp_dispatch_num_buffers]);
    sh = reinterpret_cast<dispatch_shared_info_template<T> volatile *>(
        &team->t.t_disp_buffer[my_buffer_index % __kmp_dispatch_num_buffers]);
    KD_TRACE(10, ("__kmp_dispatch_init: T#%d my_buffer_index:%d\n", gtid,
                  my_buffer_index));
  }

  __kmp_dispatch_init_algorithm(loc, gtid, pr, schedule, lb, ub, st,
#if USE_ITT_BUILD
                                &cur_chunk,
#endif
                                chunk, (T)th->th.th_team_nproc,
                                (T)th->th.th_info.ds.ds_tid);
  if (active) {
    if (pr->flags.ordered == 0) {
      th->th.th_dispatch->th_deo_fcn = __kmp_dispatch_deo_error;
      th->th.th_dispatch->th_dxo_fcn = __kmp_dispatch_dxo_error;
    } else {
      th->th.th_dispatch->th_deo_fcn = __kmp_dispatch_deo<UT>;
      th->th.th_dispatch->th_dxo_fcn = __kmp_dispatch_dxo<UT>;
    }
  }

  if (active) {
    /* The name of this buffer should be my_buffer_index when it's free to use
     * it */

    KD_TRACE(100, ("__kmp_dispatch_init: T#%d before wait: my_buffer_index:%d "
                   "sh->buffer_index:%d\n",
                   gtid, my_buffer_index, sh->buffer_index));
    __kmp_wait<kmp_uint32>(&sh->buffer_index, my_buffer_index,
                           __kmp_eq<kmp_uint32> USE_ITT_BUILD_ARG(NULL));
    // Note: KMP_WAIT() cannot be used there: buffer index and
    // my_buffer_index are *always* 32-bit integers.
    KMP_MB(); /* is this necessary? */
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d after wait: my_buffer_index:%d "
                   "sh->buffer_index:%d\n",
                   gtid, my_buffer_index, sh->buffer_index));

    th->th.th_dispatch->th_dispatch_pr_current = (dispatch_private_info_t *)pr;
    th->th.th_dispatch->th_dispatch_sh_current =
        CCAST(dispatch_shared_info_t *, (volatile dispatch_shared_info_t *)sh);
#if USE_ITT_BUILD
    if (pr->flags.ordered) {
      __kmp_itt_ordered_init(gtid);
    }
    // Report loop metadata
    if (itt_need_metadata_reporting) {
      // Only report metadata by master of active team at level 1
      kmp_uint64 schedtype = 0;
      switch (schedule) {
      case kmp_sch_static_chunked:
      case kmp_sch_static_balanced: // Chunk is calculated in the switch above
        break;
      case kmp_sch_static_greedy:
        cur_chunk = pr->u.p.parm1;
        break;
      case kmp_sch_dynamic_chunked:
        schedtype = 1;
        break;
      case kmp_sch_guided_iterative_chunked:
      case kmp_sch_guided_analytical_chunked:
      case kmp_sch_guided_simd:
        schedtype = 2;
        break;
      default:
        // Should we put this case under "static"?
        // case kmp_sch_static_steal:
        schedtype = 3;
        break;
      }
      __kmp_itt_metadata_loop(loc, schedtype, pr->u.p.tc, cur_chunk);
    }
#if KMP_USE_HIER_SCHED
    if (pr->flags.use_hier) {
      pr->u.p.count = 0;
      pr->u.p.ub = pr->u.p.lb = pr->u.p.st = pr->u.p.tc = 0;
    }
#endif // KMP_USER_HIER_SCHED
#endif /* USE_ITT_BUILD */
  }

#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format(
        "__kmp_dispatch_init: T#%%d returning: schedule:%%d ordered:%%%s "
        "lb:%%%s ub:%%%s"
        " st:%%%s tc:%%%s count:%%%s\n\tordered_lower:%%%s ordered_upper:%%%s"
        " parm1:%%%s parm2:%%%s parm3:%%%s parm4:%%%s\n",
        traits_t<UT>::spec, traits_t<T>::spec, traits_t<T>::spec,
        traits_t<ST>::spec, traits_t<UT>::spec, traits_t<UT>::spec,
        traits_t<UT>::spec, traits_t<UT>::spec, traits_t<T>::spec,
        traits_t<T>::spec, traits_t<T>::spec, traits_t<T>::spec);
    KD_TRACE(10, (buff, gtid, pr->schedule, pr->flags.ordered, pr->u.p.lb,
                  pr->u.p.ub, pr->u.p.st, pr->u.p.tc, pr->u.p.count,
                  pr->u.p.ordered_lower, pr->u.p.ordered_upper, pr->u.p.parm1,
                  pr->u.p.parm2, pr->u.p.parm3, pr->u.p.parm4));
    __kmp_str_free(&buff);
  }
#endif
#if (KMP_STATIC_STEAL_ENABLED)
  // It cannot be guaranteed that after execution of a loop with some other
  // schedule kind all the parm3 variables will contain the same value. Even if
  // all parm3 will be the same, it still exists a bad case like using 0 and 1
  // rather than program life-time increment. So the dedicated variable is
  // required. The 'static_steal_counter' is used.
  if (schedule == kmp_sch_static_steal) {
    // Other threads will inspect this variable when searching for a victim.
    // This is a flag showing that other threads may steal from this thread
    // since then.
    volatile T *p = &pr->u.p.static_steal_counter;
    *p = *p + 1;
  }
#endif // ( KMP_STATIC_STEAL_ENABLED )

#if OMPT_SUPPORT && OMPT_OPTIONAL
  if (ompt_enabled.ompt_callback_work) {
    ompt_team_info_t *team_info = __ompt_get_teaminfo(0, NULL);
    ompt_task_info_t *task_info = __ompt_get_task_info_object(0);
    ompt_callbacks.ompt_callback(ompt_callback_work)(
        ompt_work_loop, ompt_scope_begin, &(team_info->parallel_data),
        &(task_info->task_data), pr->u.p.tc,
        (th->th.ompt_thread_info.return_address)
            ? (th->th.ompt_thread_info.return_address)
            : team_info->master_return_address);
  }
#endif
  KMP_PUSH_PARTITIONED_TIMER(OMP_loop_dynamic);
}